

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O2

bool __thiscall rtosc::AutomationMgr::handleMidi(AutomationMgr *this,int channel,int type,int val)

{
  AutomationSlot *pAVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  int *piVar10;
  int i;
  long lVar11;
  double dVar12;
  int vallo;
  int valhi;
  int parlo;
  int parhi;
  double local_28;
  
  local_28 = (double)val;
  if (((type - 0x26U < 0x3e) && ((0x3000000000000001U >> ((ulong)(type - 0x26U) & 0x3f) & 1) != 0))
     || (type == 6)) {
    setparameternumber(this,type,val);
    parhi = -1;
    parlo = -1;
    valhi = -1;
    vallo = -1;
    iVar3 = getnrpn(this,&parhi,&parlo,&valhi,&vallo);
    if (iVar3 == 0) {
      iVar8 = parhi * 0x80 + parlo;
      iVar3 = valhi * 0x80 + vallo;
      lVar6 = 0xc;
      bVar7 = false;
      for (lVar11 = 0; uVar4 = this->nslots, lVar11 < (int)uVar4; lVar11 = lVar11 + 1) {
        if (*(int *)(this->slots->name + lVar6 + -0x14) == iVar8) {
          setSlot(this,(int)lVar11,(float)iVar3 / 16383.0);
          bVar7 = true;
        }
        lVar6 = lVar6 + 0xa0;
      }
      bVar2 = true;
      if (bVar7) {
        return true;
      }
    }
    else {
      uVar4 = this->nslots;
      bVar2 = false;
      iVar8 = 0;
    }
  }
  else {
    dVar12 = local_28 / 127.0;
    iVar8 = channel * 0x80 + type;
    lVar6 = 8;
    bVar7 = false;
    for (lVar11 = 0; uVar4 = this->nslots, lVar11 < (int)uVar4; lVar11 = lVar11 + 1) {
      if (*(int *)(this->slots->name + lVar6 + -0x14) == iVar8) {
        setSlot(this,(int)lVar11,(float)dVar12);
        bVar7 = true;
      }
      lVar6 = lVar6 + 0xa0;
    }
    if (bVar7) {
      return true;
    }
    bVar2 = false;
  }
  pAVar1 = this->slots;
  uVar9 = 0;
  uVar5 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar5 = uVar9;
  }
  piVar10 = &pAVar1->learning;
  while( true ) {
    if (uVar5 == uVar9) {
      return false;
    }
    if (*piVar10 == 1) break;
    uVar9 = uVar9 + 1;
    piVar10 = piVar10 + 0x28;
  }
  *piVar10 = -1;
  if (bVar2) {
    piVar10[2] = iVar8;
  }
  else {
    piVar10[1] = iVar8;
  }
  for (lVar6 = 0; uVar5 * 0xa0 - lVar6 != 0; lVar6 = lVar6 + 0xa0) {
    if (1 < *(int *)(pAVar1->name + lVar6 + -0x10)) {
      *(int *)(pAVar1->name + lVar6 + -0x10) = *(int *)(pAVar1->name + lVar6 + -0x10) + -1;
    }
  }
  this->learn_queue_len = this->learn_queue_len + -1;
  setSlot(this,(int)uVar9,(float)(local_28 / 127.0));
  this->damaged = 1;
  return false;
}

Assistant:

bool AutomationMgr::handleMidi(int channel, int type, int val)
{
    bool is_nrpn = false;
    int par_id = 0;
    int value;
    if((type == C_dataentryhi) || (type == C_dataentrylo)
       || (type == C_nrpnhi) || (type == C_nrpnlo)) { //Process RPN and NRPN by the Master (ignore the chan)
        
        setparameternumber(type, val);

        int parhi = -1, parlo = -1, valhi = -1, vallo = -1;
        if(getnrpn(&parhi, &parlo, &valhi, &vallo) == 0){ //this is NRPN
            is_nrpn = true;
            par_id = (parhi<<7) + parlo;
            value = (valhi<<7) + vallo;
            bool bound_nrpn = false;
            for(int i=0; i<nslots; ++i) {
                if(slots[i].midi_nrpn == par_id) {
                    bound_nrpn = true;
                    setSlot(i, value/16383.0);
                }
            }

        if(bound_nrpn)
            return 1;
        }
        
    }
    else {
        
        par_id = channel*128 + type;

        bool bound_cc = false;
        for(int i=0; i<nslots; ++i) {
            if(slots[i].midi_cc == par_id) {
                bound_cc = true;
                setSlot(i, val/127.0);
            }
        }

        if(bound_cc)
            return 1;
        
    }

    //No bound CC, now to see if there's something to learn
    for(int i=0; i<nslots; ++i) {
        if(slots[i].learning == 1) {
            slots[i].learning = -1;
            if (is_nrpn)
                slots[i].midi_nrpn = par_id;
            else
                slots[i].midi_cc = par_id;
            for(int j=0; j<nslots; ++j)
                if(slots[j].learning > 1)
                    slots[j].learning -= 1;
            learn_queue_len--;
            setSlot(i, val/127.0);
            damaged = 1;
            break;
        }
    }
    return 0;
}